

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# affine.c
# Opt level: O0

void glmc_scale_to(vec4 *m,float *v,vec4 *dest)

{
  float fVar1;
  undefined8 uVar2;
  float local_148;
  float fStack_144;
  float fStack_140;
  float fStack_13c;
  float local_c8;
  float fStack_c4;
  float fStack_c0;
  float fStack_bc;
  vec4 *dest_local;
  float *v_local;
  vec4 *m_local;
  float local_48;
  float fStack_44;
  float fStack_40;
  float fStack_3c;
  
  fVar1 = *v;
  local_48 = (float)*(undefined8 *)*m;
  fStack_44 = (float)((ulong)*(undefined8 *)*m >> 0x20);
  fStack_40 = (float)*(undefined8 *)(*m + 2);
  fStack_3c = (float)((ulong)*(undefined8 *)(*m + 2) >> 0x20);
  *(ulong *)*dest = CONCAT44(fStack_44 * fVar1,local_48 * fVar1);
  *(ulong *)(*dest + 2) = CONCAT44(fStack_3c * fVar1,fStack_40 * fVar1);
  fVar1 = v[1];
  local_c8 = (float)*(undefined8 *)m[1];
  fStack_c4 = (float)((ulong)*(undefined8 *)m[1] >> 0x20);
  fStack_c0 = (float)*(undefined8 *)(m[1] + 2);
  fStack_bc = (float)((ulong)*(undefined8 *)(m[1] + 2) >> 0x20);
  *(ulong *)dest[1] = CONCAT44(fStack_c4 * fVar1,local_c8 * fVar1);
  *(ulong *)(dest[1] + 2) = CONCAT44(fStack_bc * fVar1,fStack_c0 * fVar1);
  fVar1 = v[2];
  local_148 = (float)*(undefined8 *)m[2];
  fStack_144 = (float)((ulong)*(undefined8 *)m[2] >> 0x20);
  fStack_140 = (float)*(undefined8 *)(m[2] + 2);
  fStack_13c = (float)((ulong)*(undefined8 *)(m[2] + 2) >> 0x20);
  *(ulong *)dest[2] = CONCAT44(fStack_144 * fVar1,local_148 * fVar1);
  *(ulong *)(dest[2] + 2) = CONCAT44(fStack_13c * fVar1,fStack_140 * fVar1);
  uVar2 = *(undefined8 *)(m[3] + 2);
  *(undefined8 *)dest[3] = *(undefined8 *)m[3];
  *(undefined8 *)(dest[3] + 2) = uVar2;
  return;
}

Assistant:

CGLM_EXPORT
void
glmc_scale_to(mat4 m, vec3 v, mat4 dest) {
  glm_scale_to(m, v, dest);
}